

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O3

void test_comments_9(void)

{
  run("all standalone comment lines should be removed",
      "Begin.\n  {{!\n    Something\'s going on here...\n  }}\nEnd.\n","{}",(char *)0x0,
      "Begin.\nEnd.\n");
  return;
}

Assistant:

static void
test_comments_9(void)
{
    run(
        "all standalone comment lines should be removed",
        "Begin.\n  {{!\n    Something's going on here...\n  }}\nEnd.\n",
        "{}",
        NULL,
        "Begin.\nEnd.\n"
    );
}